

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void quantize_dc(tran_low_t *coeff_ptr,int n_coeffs,int skip_block,int16_t *round_ptr,int16_t quant,
                tran_low_t *qcoeff_ptr,tran_low_t *dqcoeff_ptr,int16_t dequant_ptr,uint16_t *eob_ptr
                ,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  short *in_RCX;
  int in_EDX;
  int in_ESI;
  uint *in_RDI;
  short in_R8W;
  int *in_R9;
  int *in_stack_00000008;
  tran_low_t abs_dqcoeff;
  int iwt;
  int wt;
  int dequant;
  int32_t tmp32;
  int eob;
  int64_t tmp;
  int abs_coeff;
  int coeff_sign;
  int coeff;
  int rc;
  undefined4 local_60;
  undefined4 local_5c;
  undefined2 local_44;
  
  uVar3 = *in_RDI;
  uVar1 = 0;
  if ((int)uVar3 < 0) {
    uVar1 = 0xffffffff;
  }
  local_44 = -1;
  memset(in_R9,0,(long)in_ESI << 2);
  memset(in_stack_00000008,0,(long)in_ESI << 2);
  if (in_EDX == 0) {
    if (_tmp32 == (byte *)0x0) {
      local_5c = 0x20;
    }
    else {
      local_5c = (uint)*_tmp32;
    }
    if (tmp == 0) {
      local_60 = 0x20;
    }
    else {
      local_60 = (uint)*(byte *)tmp;
    }
    bVar4 = (byte)abs_coeff;
    iVar2 = clamp(((uVar3 ^ uVar1) - uVar1) +
                  ((int)*in_RCX + ((1 << (bVar4 & 0x1f)) >> 1) >> (bVar4 & 0x1f)),-0x8000,0x7fff);
    uVar3 = (uint)((long)iVar2 * (long)(int)local_5c * (long)in_R8W >> (0x15 - bVar4 & 0x3f));
    *in_R9 = (uVar3 ^ uVar1) - uVar1;
    *in_stack_00000008 =
         ((int)(uVar3 * ((int)((int)(short)abs_dqcoeff * local_60 + 0x10) >> 5)) >> (bVar4 & 0x1f) ^
         uVar1) - uVar1;
    local_44 = -1;
    if (uVar3 != 0) {
      local_44 = 0;
    }
  }
  *_wt = local_44 + 1;
  return;
}

Assistant:

static void quantize_dc(const tran_low_t *coeff_ptr, int n_coeffs,
                        int skip_block, const int16_t *round_ptr,
                        const int16_t quant, tran_low_t *qcoeff_ptr,
                        tran_low_t *dqcoeff_ptr, const int16_t dequant_ptr,
                        uint16_t *eob_ptr, const qm_val_t *qm_ptr,
                        const qm_val_t *iqm_ptr, const int log_scale) {
  const int rc = 0;
  const int coeff = coeff_ptr[rc];
  const int coeff_sign = AOMSIGN(coeff);
  const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
  int64_t tmp;
  int eob = -1;
  int32_t tmp32;
  int dequant;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  if (!skip_block) {
    const int wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
    tmp = clamp(abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale),
                INT16_MIN, INT16_MAX);
    tmp32 = (int32_t)((tmp * wt * quant) >> (16 - log_scale + AOM_QM_BITS));
    qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
    dequant = (dequant_ptr * iwt + (1 << (AOM_QM_BITS - 1))) >> AOM_QM_BITS;
    const tran_low_t abs_dqcoeff = (tmp32 * dequant) >> log_scale;
    dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
    if (tmp32) eob = 0;
  }
  *eob_ptr = eob + 1;
}